

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O1

void fekete_rule(int rule,int param_2,double *xy,double *w)

{
  int iVar1;
  uint suborder_num;
  int iVar2;
  int iVar3;
  int iVar4;
  double *suborder_xyz;
  double *suborder_w;
  int *piVar5;
  ostream *poVar6;
  int iVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  
  suborder_num = fekete_suborder_num(rule);
  suborder_xyz = (double *)operator_new__((ulong)(suborder_num * 0x18));
  suborder_w = (double *)operator_new__((ulong)(suborder_num * 8));
  piVar5 = fekete_suborder(rule,suborder_num);
  fekete_subrule(rule,suborder_num,suborder_xyz,suborder_w);
  uVar8 = 0;
  iVar4 = 0;
  do {
    iVar2 = piVar5[uVar8];
    if (iVar2 == 1) {
      xy[iVar4 * 2] = suborder_xyz[uVar8 * 3];
      xy[iVar4 * 2 + 1] = suborder_xyz[uVar8 * 3 + 1];
      w[iVar4] = suborder_w[uVar8];
      iVar4 = iVar4 + 1;
    }
    else {
      iVar1 = (int)uVar8;
      if (iVar2 == 3) {
        pdVar9 = xy + (long)iVar4 * 2 + 1;
        lVar10 = 0;
        do {
          iVar2 = i4_wrap((int)lVar10,0,2);
          pdVar9[-1] = suborder_xyz[iVar2 + iVar1 * 3];
          iVar3 = (int)(lVar10 + 1);
          iVar2 = i4_wrap(iVar3,0,2);
          *pdVar9 = suborder_xyz[iVar2 + iVar1 * 3];
          w[iVar4 + lVar10] = suborder_w[uVar8];
          pdVar9 = pdVar9 + 2;
          lVar10 = lVar10 + 1;
        } while (iVar3 != 3);
        iVar4 = iVar4 + 3;
      }
      else {
        if (iVar2 != 6) {
          std::operator<<((ostream *)&std::cerr,"\n");
          std::operator<<((ostream *)&std::cerr,"FEKETE_RULE - Fatal error!\n;");
          poVar6 = std::operator<<((ostream *)&std::cerr,"  Illegal SUBORDER(");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
          poVar6 = std::operator<<(poVar6,") = ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,piVar5[uVar8]);
          std::operator<<(poVar6,"\n");
          exit(1);
        }
        pdVar9 = xy + (long)iVar4 * 2 + 1;
        lVar10 = 0;
        iVar2 = iVar4;
        do {
          iVar2 = iVar2 + 1;
          iVar3 = i4_wrap((int)lVar10,0,2);
          pdVar9[-1] = suborder_xyz[iVar3 + iVar1 * 3];
          iVar7 = (int)(lVar10 + 1);
          iVar3 = i4_wrap(iVar7,0,2);
          *pdVar9 = suborder_xyz[iVar3 + iVar1 * 3];
          w[iVar4 + lVar10] = suborder_w[uVar8];
          pdVar9 = pdVar9 + 2;
          lVar10 = lVar10 + 1;
        } while (iVar7 != 3);
        lVar10 = (long)iVar2 << 3;
        iVar4 = iVar4 + 6;
        iVar2 = 0;
        do {
          iVar7 = iVar2 + 1;
          iVar3 = i4_wrap(iVar7,0,2);
          *(double *)((long)xy + lVar10 * 2) = suborder_xyz[iVar3 + iVar1 * 3];
          iVar2 = i4_wrap(iVar2,0,2);
          *(double *)((long)xy + lVar10 * 2 + 8) = suborder_xyz[iVar2 + iVar1 * 3];
          *(double *)((long)w + lVar10) = suborder_w[uVar8];
          lVar10 = lVar10 + 8;
          iVar2 = iVar7;
        } while (iVar7 != 3);
      }
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != suborder_num);
  operator_delete__(piVar5);
  operator_delete__(suborder_xyz);
  operator_delete__(suborder_w);
  return;
}

Assistant:

void fekete_rule ( int rule, int /*order_num*/, double xy[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_RULE returns the points and weights of a Fekete rule.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 January 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Input, int ORDER_NUM, the order (number of points) of the rule.
//
//    Output, double XY[2*ORDER_NUM], the points of the rule.
//
//    Output, double W[ORDER_NUM], the weights of the rule.
//
{
  int k;
  int o;
  int s;
  int *suborder;
  int suborder_num;
  double *suborder_w;
  double *suborder_xyz;
//
//  Get the suborder information.
//
  suborder_num = fekete_suborder_num ( rule );

  suborder_xyz = new double[3*suborder_num];
  suborder_w = new double[suborder_num];

  suborder = fekete_suborder ( rule, suborder_num );

  fekete_subrule ( rule, suborder_num, suborder_xyz, suborder_w );
//
//  Expand the suborder information to a full order rule.
//
  o = 0;

  for ( s = 0; s < suborder_num; s++ )
  {
    if ( suborder[s] == 1 )
    {
      xy[0+o*2] = suborder_xyz[0+s*3];
      xy[1+o*2] = suborder_xyz[1+s*3];
      w[o] = suborder_w[s];
      o = o + 1;
    }
    else if ( suborder[s] == 3 )
    {
      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }
    }
    else if ( suborder[s] == 6 )
    {
      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }

      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }
    }
    else
    {
      std::cerr << "\n";
      std::cerr << "FEKETE_RULE - Fatal error!\n;";
      std::cerr << "  Illegal SUBORDER(" << s << ") = " << suborder[s] << "\n";
      exit ( 1 );
    }
  }

  delete [] suborder;
  delete [] suborder_xyz;
  delete [] suborder_w;

  return;
}